

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O2

string * AssignIterator(string *__return_storage_ptr__,string *FileName)

{
  istreambuf_iterator<char,_std::char_traits<char>_> __first;
  ifstream ResultReader;
  undefined8 auStack_130 [36];
  
  std::ifstream::ifstream(&ResultReader,(string *)FileName,_S_in|_S_bin);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::istream::seekg((long)&ResultReader,_S_beg);
  std::istream::tellg();
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  std::istream::seekg((long)&ResultReader,_S_beg);
  __first._8_8_ = 0xffffffffffffffff;
  __first._M_sbuf = *(streambuf_type **)((long)auStack_130 + *(long *)(_ResultReader + -0x18));
  std::__cxx11::string::assign<std::istreambuf_iterator<char,std::char_traits<char>>,void>
            ((string *)__return_storage_ptr__,__first,
             (istreambuf_iterator<char,_std::char_traits<char>_>)(ZEXT816(0xffffffff) << 0x40));
  std::ifstream::close();
  std::ifstream::~ifstream(&ResultReader);
  return __return_storage_ptr__;
}

Assistant:

std::string AssignIterator(std::string FileName)
{
    std::ifstream ResultReader(FileName, std::ios::in | std::ios::binary);
    std::string Results;
    ResultReader.seekg(0, std::ios::end);
    Results.reserve(ResultReader.tellg());
    ResultReader.seekg(0, std::ios::beg);
    Results.assign((std::istreambuf_iterator<char>(ResultReader)), std::istreambuf_iterator<char>());
    ResultReader.close();
    return(Results);
}